

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O2

bool __thiscall
CorUnix::CSharedMemoryObject::ReleaseObjectDestructionLock
          (CSharedMemoryObject *this,CPalThread *pthr,bool fDestructionPending)

{
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  bool bVar3;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReleaseObjectDestructionLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x2c8);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (fDestructionPending) {
      p_Var1 = (this->m_le).Flink;
      p_Var2 = (this->m_le).Blink;
      p_Var2->Flink = p_Var1;
      p_Var1->Blink = p_Var2;
      bVar3 = DereferenceSharedData(this);
    }
    else {
      bVar3 = false;
    }
    InternalLeaveCriticalSection(pthr,this->m_pcsObjListLock);
    if (PAL_InitializeChakraCoreCalled != false) {
      return bVar3;
    }
  }
  abort();
}

Assistant:

bool
CSharedMemoryObject::ReleaseObjectDestructionLock(
    CPalThread *pthr,
    bool fDestructionPending
    )
{
    bool fCleanupSharedState = FALSE;

    _ASSERTE(NULL != pthr);

    ENTRY("CSharedMemoryObject::ReleaseObjectDestructionLock"
        "(this = %p, pthr = %p, fDestructionPending = %d\n",
        this,
        pthr,
        fDestructionPending
        );
    
    if (fDestructionPending)
    {
        RemoveEntryList(&m_le);
        fCleanupSharedState = DereferenceSharedData();
    }

    InternalLeaveCriticalSection(pthr, m_pcsObjListLock);

    LOGEXIT("CSharedMemoryObject::ReleaseObjectDestructionLock returns %d\n",
        fCleanupSharedState
        );

    return fCleanupSharedState;
}